

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::VoidCastedCallStatementSyntax::setChild
          (VoidCastedCallStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004b73a8 + *(int *)(&DAT_004b73a8 + index * 4)))();
  return;
}

Assistant:

void VoidCastedCallStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: voidKeyword = child.token(); return;
        case 3: apostrophe = child.token(); return;
        case 4: openParen = child.token(); return;
        case 5: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 6: closeParen = child.token(); return;
        case 7: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}